

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

bool __thiscall
Sudoku::rowCheck(Sudoku *this,
                list<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_> *furtherWays_,
                vector<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_> *testFields
                ,bool recordFullFurtherWays,bool debug)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  int value;
  int x;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint posY;
  uint local_54;
  
  posY = 0;
  iVar4 = this->squared_size_;
  do {
    if (iVar4 <= (int)posY) {
LAB_00110d01:
      return (int)posY < iVar4;
    }
    iVar5 = iVar4;
    for (value = 1; value <= iVar5; value = value + 1) {
      uVar9 = 0;
      local_54 = 0;
      uVar8 = 0;
      do {
        uVar7 = (uint)uVar8;
        if (this->squared_size_ <= (int)uVar7) {
          if (uVar9 == 1) {
            if (debug) {
              poVar6 = std::operator<<((ostream *)&std::cout,"  Row check (row ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,posY);
              poVar6 = std::operator<<(poVar6,"): value ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,value);
              poVar6 = std::operator<<(poVar6," has to be in field (");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_54);
              poVar6 = std::operator<<(poVar6,",");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,posY);
              poVar6 = std::operator<<(poVar6,",");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->current_z_);
              poVar6 = std::operator<<(poVar6,")");
              std::endl<char,std::char_traits<char>>(poVar6);
            }
            p_Var2 = (furtherWays_->
                     super__List_base<Sudoku::FurtherWays,_std::allocator<Sudoku::FurtherWays>_>).
                     _M_impl._M_node.super__List_node_base._M_prev;
            p_Var1 = p_Var2 + 1;
            *(int *)&p_Var1->_M_next = *(int *)&p_Var1->_M_next + 1;
            iVar5 = (*this->_vptr_Sudoku[7])(this,(ulong)local_54,(ulong)posY);
            FurtherWays::addWay((FurtherWays *)(p_Var2 + 1),iVar5,local_54,posY,this->current_z_,
                                value,onlyPositionInRow);
            if (!recordFullFurtherWays) {
              iVar5 = (*this->_vptr_Sudoku[7])(this,(ulong)local_54,(ulong)posY);
              Field::setValue((testFields->
                              super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[iVar5].
                              super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
              goto LAB_00110d01;
            }
          }
          break;
        }
        (*this->_vptr_Sudoku[7])(this,uVar8,(ulong)posY);
        iVar5 = (*this->_vptr_Sudoku[7])(this,uVar8,(ulong)posY);
        iVar5 = Field::value((testFields->
                             super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[iVar5].
                             super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        if (iVar5 == value) break;
        iVar5 = (*this->_vptr_Sudoku[7])(this,uVar8,(ulong)posY);
        bVar3 = Field::valuePossible
                          ((testFields->
                           super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                           )._M_impl.super__Vector_impl_data._M_start[iVar5].
                           super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr,value);
        uVar9 = uVar9 + bVar3;
        if (bVar3) {
          local_54 = uVar7;
        }
        uVar8 = (ulong)(uVar7 + 1);
      } while (uVar9 < 2);
      iVar5 = this->squared_size_;
    }
    posY = posY + 1;
    iVar4 = iVar5;
  } while( true );
}

Assistant:

bool Sudoku::rowCheck(std::list<FurtherWays> &furtherWays_, std::vector<std::shared_ptr<Field>> &testFields, bool recordFullFurtherWays, bool debug)
{
  bool restart = false;

  //check rows, if there are values that can only be at one position
  restart = false;

  // loop over rows
  for (int y = 0; y < squared_size_; y++)
  {
    // loop over all values
    for (int value = 1; value <= squared_size_; value++)
    {
      // check if value is already set (valueIsAlreadySet),
      // or can only be at exactly one position in this row (nPossiblePositionsForValue==1), then it is position positionX
      bool valueIsAlreadySet = false;
      int nPossiblePositionsForValue = 0;
      int positionX = 0;

      // loop over fields in row
      for (int x = 0; x < squared_size_; x++)
      {
        int i = index(x,y);
        int si = testFields.size();
        if(testFields[index(x,y)]->value() == value)
        {
          valueIsAlreadySet = true;
          break;
        }

        if(testFields[index(x,y)]->valuePossible(value))
        {
          nPossiblePositionsForValue++;
          positionX = x;
        }
        if(nPossiblePositionsForValue > 1)
          break;
      }

      //if Value can only be at one position, set it there
      if(nPossiblePositionsForValue == 1 && !valueIsAlreadySet)
      {
        if(debug)
          std::cout<<"  Row check (row "<<y<<"): value "<<value<<" has to be in field ("<<positionX<<","<<y<<","<<current_z_<<")"<<std::endl;

        furtherWays_.back().nRowCheckMatches++;    // increment number of occurences that a value can only be at one position in a row
        furtherWays_.back().addWay(index(positionX,y), positionX, y, current_z_, value, FurtherWays::Reason::onlyPositionInRow);

        if(!recordFullFurtherWays)
        {
          testFields[index(positionX,y)]->setValue(value);
          restart = true;
          break;
        }
      }
    }
    if(restart)
      break;
  }
  return restart;
}